

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void StoreSymbolWithContext
               (BlockEncoder *self,size_t symbol,size_t context,uint32_t *context_map,
               size_t *storage_ix,uint8_t *storage,size_t context_bits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar6 = self->block_len_;
  if (sVar6 == 0) {
    sVar6 = self->block_ix_;
    self->block_ix_ = sVar6 + 1;
    uVar4 = self->block_lengths_[sVar6 + 1];
    uVar9 = (ulong)self->block_types_[sVar6 + 1];
    self->block_len_ = (ulong)uVar4;
    self->entropy_ix_ = uVar9 << ((byte)context_bits & 0x3f);
    sVar6 = (self->block_split_code_).type_code_calculator.last_type;
    if (sVar6 + 1 == uVar9) {
      lVar5 = 1;
    }
    else {
      lVar5 = 0;
      if ((self->block_split_code_).type_code_calculator.second_last_type != uVar9) {
        lVar5 = uVar9 + 2;
      }
    }
    (self->block_split_code_).type_code_calculator.second_last_type = sVar6;
    (self->block_split_code_).type_code_calculator.last_type = uVar9;
    uVar9 = *storage_ix;
    uVar8 = (self->block_split_code_).type_depths[lVar5] + uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)(self->block_split_code_).type_bits[lVar5] << ((byte)uVar9 & 7) |
         (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar8;
    uVar9 = 0xe;
    if (0x2f0 < uVar4) {
      uVar9 = 0x14;
    }
    uVar7 = 7;
    if (uVar4 < 0x29) {
      uVar7 = 0;
    }
    if (0xb0 < uVar4) {
      uVar7 = uVar9;
    }
    do {
      uVar9 = 0x19;
      if (0x18 < uVar7) break;
      lVar5 = uVar7 * 2;
      uVar9 = uVar7;
      uVar7 = uVar7 + 1;
    } while ((ushort)(&DAT_0216a3f4)[lVar5] <= uVar4);
    bVar1 = (&DAT_0216a3f2)[uVar9 * 4];
    uVar3 = (&duckdb_brotli::_kBrotliPrefixCodeRanges)[uVar9 * 2];
    bVar2 = (self->block_split_code_).length_depths[uVar9];
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)(self->block_split_code_).length_bits[uVar9] << ((byte)uVar8 & 7) |
         (ulong)storage[uVar8 >> 3];
    uVar8 = bVar2 + uVar8;
    *storage_ix = uVar8;
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)(uVar4 - uVar3) << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar8 + bVar1;
    sVar6 = self->block_len_;
  }
  self->block_len_ = sVar6 - 1;
  lVar5 = (ulong)context_map[self->entropy_ix_ + context] * self->histogram_length_ + symbol;
  bVar1 = self->depths_[lVar5];
  uVar9 = *storage_ix;
  *(ulong *)(storage + (uVar9 >> 3)) =
       (ulong)self->bits_[lVar5] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
  *storage_ix = bVar1 + uVar9;
  return;
}

Assistant:

static void StoreSymbolWithContext(BlockEncoder* self, size_t symbol,
    size_t context, const uint32_t* context_map, size_t* storage_ix,
    uint8_t* storage, const size_t context_bits) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = (size_t)block_type << context_bits;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t histo_ix = context_map[self->entropy_ix_ + context];
    size_t ix = histo_ix * self->histogram_length_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}